

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  byte bVar1;
  short sVar2;
  Schema *pSVar3;
  Schema *pSVar4;
  uint p2;
  uint uVar5;
  Incrblob *p;
  Table *pTVar6;
  Vdbe *p_00;
  VdbeOp *pVVar7;
  long lVar8;
  Schema **ppSVar9;
  Op *pOVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  FKey *pFVar14;
  ulong uVar15;
  Index *pIVar16;
  Vdbe *v;
  ulong uVar17;
  char *zErr;
  Parse sParse;
  int local_220;
  char *local_218;
  int local_210;
  uint local_20c;
  sqlite3 *local_208;
  Table *local_200;
  char *local_1f8;
  VdbeOp *local_1f0;
  sqlite_int64 local_1e8;
  Incrblob *local_1e0;
  char *local_1d8;
  Parse local_1d0;
  
  local_218 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_210 = wrFlag;
  local_1f8 = zTable;
  local_1e8 = iRow;
  local_1d8 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p2 = (uint)(wrFlag != 0);
  p = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  local_220 = 0;
  local_20c = 0;
  local_208 = db;
  local_1e0 = p;
  do {
    memset(&local_1d0.zErrMsg,0,0xd8);
    memset(&local_1d0.sLastToken,0,0x88);
    local_1d0.pOuterParse = db->pParse;
    db->pParse = &local_1d0;
    local_1d0.db = db;
    if (db->mallocFailed != '\0') {
      sqlite3ErrorMsg(&local_1d0,"out of memory");
    }
    if (p == (Incrblob *)0x0) goto LAB_0012592f;
    if (local_218 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_218);
    }
    local_218 = (char *)0x0;
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    pTVar6 = sqlite3LocateTable(&local_1d0,0,local_1f8,local_1d8);
    if (pTVar6 == (Table *)0x0) {
LAB_001259a0:
      if (local_1d0.zErrMsg != (char *)0x0) {
        local_218 = local_1d0.zErrMsg;
        local_1d0.zErrMsg = (char *)0x0;
      }
      local_220 = 1;
      if (db->noSharedCache == '\0') {
        btreeLeaveAll(db);
      }
      goto LAB_00125a05;
    }
    if (pTVar6->eTabType == '\x01') {
      pcVar12 = "cannot open virtual table: %s";
LAB_0012598f:
      sqlite3ErrorMsg(&local_1d0,pcVar12,local_1f8);
      goto LAB_001259a0;
    }
    if ((pTVar6->tabFlags & 0x80) != 0) {
      pcVar12 = "cannot open table without rowid: %s";
      goto LAB_0012598f;
    }
    if (pTVar6->eTabType == '\x02') {
      pcVar12 = "cannot open view: %s";
      goto LAB_0012598f;
    }
    p->pTab = pTVar6;
    if (pTVar6->pSchema == (Schema *)0x0) {
      lVar8 = -0x8000;
    }
    else {
      lVar8 = -0x100000000;
      ppSVar9 = &db->aDb->pSchema;
      do {
        lVar8 = lVar8 + 0x100000000;
        pSVar3 = *ppSVar9;
        ppSVar9 = ppSVar9 + 4;
      } while (pSVar3 != pTVar6->pSchema);
      lVar8 = lVar8 >> 0x20;
    }
    p->zDb = db->aDb[lVar8].zDbSName;
    sVar2 = pTVar6->nCol;
    if (0 < sVar2) {
      uVar17 = 0;
LAB_00125664:
      lVar8 = 0;
      do {
        bVar1 = pTVar6->aCol[uVar17].zCnName[lVar8];
        if (bVar1 == zColumn[lVar8]) {
          if ((ulong)bVar1 == 0) goto LAB_001256a6;
        }
        else if (""[bVar1] != ""[(byte)zColumn[lVar8]]) goto LAB_00125696;
        lVar8 = lVar8 + 1;
      } while( true );
    }
    uVar17 = 0;
LAB_001256a6:
    uVar5 = (uint)uVar17;
    if (uVar5 == (int)sVar2) {
LAB_00125967:
      pcVar12 = "no such column: \"%s\"";
LAB_001259d9:
      local_218 = sqlite3MPrintf(db,pcVar12,zColumn);
      local_220 = 1;
      if (db->noSharedCache == '\0') {
        btreeLeaveAll(db);
        local_220 = 1;
      }
      goto LAB_00125a00;
    }
    if (local_210 != 0) {
      if (((db->flags & 0x4000) == 0) || (pFVar14 = (pTVar6->u).tab.pFKey, pFVar14 == (FKey *)0x0))
      {
        pcVar11 = (char *)0x0;
      }
      else {
        pcVar11 = (char *)0x0;
        do {
          if (0 < (long)pFVar14->nCol) {
            lVar8 = 0;
            do {
              if (*(uint *)((long)&pFVar14->aCol[0].iFrom + lVar8) == uVar5) {
                pcVar11 = "foreign key";
              }
              lVar8 = lVar8 + 0x10;
            } while ((long)pFVar14->nCol * 0x10 != lVar8);
          }
          pFVar14 = pFVar14->pNextFrom;
        } while (pFVar14 != (FKey *)0x0);
      }
      for (pIVar16 = pTVar6->pIndex; pIVar16 != (Index *)0x0; pIVar16 = pIVar16->pNext) {
        if ((ulong)pIVar16->nKeyCol != 0) {
          uVar15 = 0;
          do {
            if (uVar5 == (int)pIVar16->aiColumn[uVar15]) {
              pcVar11 = "indexed";
            }
            if ((int)pIVar16->aiColumn[uVar15] == 0xfffffffe) {
              pcVar11 = "indexed";
            }
            uVar15 = uVar15 + 1;
          } while (pIVar16->nKeyCol != uVar15);
        }
      }
      if (pcVar11 != (char *)0x0) {
        pcVar12 = "cannot open %s column for writing";
        zColumn = pcVar11;
        goto LAB_001259d9;
      }
    }
    local_200 = pTVar6;
    p_00 = sqlite3VdbeCreate(&local_1d0);
    p->pStmt = (sqlite3_stmt *)p_00;
    if (p_00 != (Vdbe *)0x0) {
      pSVar3 = local_200->pSchema;
      if (pSVar3 == (Schema *)0x0) {
        iVar13 = -0x8000;
      }
      else {
        iVar13 = -1;
        ppSVar9 = &local_208->aDb->pSchema;
        do {
          iVar13 = iVar13 + 1;
          pSVar4 = *ppSVar9;
          ppSVar9 = ppSVar9 + 4;
        } while (pSVar4 != pSVar3);
      }
      pOVar10 = (Op *)(ulong)p2;
      sqlite3VdbeAddOp4Int(p_00,2,iVar13,p2,pSVar3->schema_cookie,pSVar3->iGeneration);
      if (0 < (long)p_00->nOp) {
        pOVar10 = p_00->aOp;
        pOVar10[(long)p_00->nOp + -1].p5 = 1;
      }
      pVVar7 = sqlite3VdbeAddOpList(p_00,6,sqlite3_blob_open::openBlob,(int)pOVar10);
      uVar5 = 1 << ((byte)iVar13 & 0x1f);
      p_00->btreeMask = p_00->btreeMask | uVar5;
      if ((iVar13 != 1) && ((p_00->db->aDb[iVar13].pBt)->sharable != '\0')) {
        p_00->lockMask = p_00->lockMask | uVar5;
      }
      if (local_208->mallocFailed == '\0') {
        pVVar7->p1 = iVar13;
        pVVar7->p2 = local_200->tnum;
        pVVar7->p3 = p2;
        local_1f0 = pVVar7;
        sqlite3VdbeChangeP4(p_00,2,local_200->zName,0);
        if (local_208->mallocFailed == '\0') {
          if (local_210 != 0) {
            local_1f0[1].opcode = 'q';
          }
          local_1f0[1].p2 = local_200->tnum;
          local_1f0[1].p3 = iVar13;
          local_1f0[1].p4type = -3;
          local_1f0[1].p4.i = local_200->nCol + 1;
          local_1f0[3].p2 = (int)local_200->nCol;
          local_1d0.nVar = 0;
          local_1d0.nTab = 1;
          local_1d0.nMem = 1;
          sqlite3VdbeMakeReady(p_00,&local_1d0);
        }
      }
    }
    p = local_1e0;
    db = local_208;
    local_1e0->iCol = (u16)uVar17;
    local_1e0->db = local_208;
    if (local_208->noSharedCache == '\0') {
      btreeLeaveAll(local_208);
    }
    if (((db->mallocFailed != '\0') ||
        (local_220 = blobSeekToRow(p,local_1e8,&local_218), 0x30 < local_20c)) ||
       (local_220 != 0x11)) goto LAB_00125926;
    local_20c = local_20c + 1;
    sqlite3ParseObjectReset(&local_1d0);
    local_220 = 0x11;
  } while( true );
LAB_00125696:
  uVar17 = uVar17 + 1;
  if (uVar17 == (uint)(int)sVar2) goto LAB_00125967;
  goto LAB_00125664;
LAB_00125926:
  if (local_220 == 0) {
LAB_0012592f:
    local_220 = 0;
    if (db->mallocFailed == '\0') {
      *ppBlob = (sqlite3_blob *)p;
      pcVar12 = "%s";
      if (local_218 == (char *)0x0) {
        pcVar12 = (char *)0x0;
      }
      local_220 = 0;
      goto LAB_00125a39;
    }
LAB_00125a00:
    if (p != (Incrblob *)0x0) goto LAB_00125a05;
  }
  else {
LAB_00125a05:
    if ((Vdbe *)p->pStmt != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)p->pStmt);
    }
    sqlite3DbFreeNN(db,p);
  }
  pcVar12 = "%s";
  if (local_218 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
LAB_00125a39:
  pcVar11 = local_218;
  sqlite3ErrorWithMsg(db,local_220,pcVar12,local_218);
  if (pcVar11 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar11);
  }
  sqlite3ParseObjectReset(&local_1d0);
  if ((local_220 != 0) || (iVar13 = 0, db->mallocFailed != '\0')) {
    iVar13 = apiHandleError(db,local_220);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar13;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Incrblob *pBlob = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  while(1){
    sqlite3ParseObjectInit(&sParse,db);
    if( !pBlob ) goto blob_open_out;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(&sParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && IsView(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( sParse.zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = sParse.zErrMsg;
        sParse.zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zCnName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key.
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this
        ** case.  */
        FKey *pFKey;
        assert( IsOrdinaryTable(pTab) );
        for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(&sParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){

      /* This VDBE program seeks a btree cursor to the identified
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag,
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);
      assert( sqlite3VdbeCurrentAddr(v)==2 || db->mallocFailed );
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb);

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        sParse.nVar = 0;
        sParse.nMem = 1;
        sParse.nTab = 1;
        sqlite3VdbeMakeReady(v, &sParse);
      }
    }

    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
    if( (++nAttempt)>=SQLITE_MAX_SCHEMA_RETRY || rc!=SQLITE_SCHEMA ) break;
    sqlite3ParseObjectReset(&sParse);
  }

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : (char*)0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParseObjectReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}